

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,pluralise *pluraliser)

{
  ostream *poVar1;
  ulong *in_RSI;
  ostream *in_RDI;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)(in_RSI + 1));
  if (*in_RSI != 1) {
    std::operator<<(in_RDI,"s");
  }
  return in_RDI;
}

Assistant:

std::ostream& operator << ( std::ostream& os, pluralise const& pluraliser ) {
        os << pluraliser.m_count << " " << pluraliser.m_label;
        if( pluraliser.m_count != 1 )
            os << "s";
        return os;
    }